

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetKey(GLFWwindow *handle,int key)

{
  _GLFWwindow *window;
  int key_local;
  GLFWwindow *handle_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local._4_4_ = 0;
  }
  else if ((key < 0) || (0x15c < key)) {
    _glfwInputError(0x10003,"The specified key is invalid");
    handle_local._4_4_ = 0;
  }
  else if (handle[(long)key + 0x5c] == (GLFWwindow)0x3) {
    handle[(long)key + 0x5c] = (GLFWwindow)0x0;
    handle_local._4_4_ = 1;
  }
  else {
    handle_local._4_4_ = (int)(char)handle[(long)key + 0x5c];
  }
  return handle_local._4_4_;
}

Assistant:

GLFWAPI int glfwGetKey(GLFWwindow* handle, int key)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_RELEASE);

    if (key < 0 || key > GLFW_KEY_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "The specified key is invalid");
        return GLFW_RELEASE;
    }

    if (window->key[key] == _GLFW_STICK)
    {
        // Sticky mode: release key now
        window->key[key] = GLFW_RELEASE;
        return GLFW_PRESS;
    }

    return (int) window->key[key];
}